

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.cc
# Opt level: O1

bool SpeedECDSA(string *selected)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  EC_GROUP *pEVar5;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ECDSA P-224","");
  pEVar5 = EC_group_p224();
  bVar2 = SpeedECDSACurve(&local_50,pEVar5,selected);
  if (bVar2) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ECDSA P-256","");
    pEVar5 = EC_group_p256();
    bVar3 = SpeedECDSACurve(&local_70,pEVar5,selected);
    if (!bVar3) goto LAB_0012c59f;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"ECDSA P-384","");
    pEVar5 = EC_group_p384();
    bVar3 = SpeedECDSACurve(&local_b0,pEVar5,selected);
    if (bVar3) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"ECDSA P-521","");
      pEVar5 = EC_group_p521();
      bVar4 = SpeedECDSACurve(&local_90,pEVar5,selected);
      bVar3 = true;
      bVar1 = true;
      goto LAB_0012c5a6;
    }
    bVar3 = true;
  }
  else {
LAB_0012c59f:
    bVar3 = false;
  }
  bVar1 = false;
  bVar4 = false;
LAB_0012c5a6:
  if ((bVar1) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2)) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((bVar3) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2)) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((bVar2) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

static bool SpeedECDSA(const std::string &selected) {
  return SpeedECDSACurve("ECDSA P-224", EC_group_p224(), selected) &&
         SpeedECDSACurve("ECDSA P-256", EC_group_p256(), selected) &&
         SpeedECDSACurve("ECDSA P-384", EC_group_p384(), selected) &&
         SpeedECDSACurve("ECDSA P-521", EC_group_p521(), selected);
}